

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O2

FT_Error FT_Outline_New_Internal
                   (FT_Memory memory,FT_UInt numPoints,FT_Int numContours,FT_Outline *anoutline)

{
  FT_Error FVar1;
  undefined8 in_RAX;
  FT_Vector *pFVar2;
  char *pcVar3;
  short *psVar4;
  int local_34 [2];
  FT_Error error;
  
  local_34[0] = (int)((ulong)in_RAX >> 0x20);
  FVar1 = 6;
  if (memory != (FT_Memory)0x0 && anoutline != (FT_Outline *)0x0) {
    *(undefined8 *)&anoutline->flags = 0;
    anoutline->tags = (char *)0x0;
    anoutline->contours = (short *)0x0;
    anoutline->n_contours = 0;
    anoutline->n_points = 0;
    *(undefined4 *)&anoutline->field_0x4 = 0;
    anoutline->points = (FT_Vector *)0x0;
    if ((uint)numContours <= numPoints && -1 < numContours) {
      if (numPoints < 0x8000) {
        pFVar2 = (FT_Vector *)ft_mem_realloc(memory,0x10,0,(ulong)numPoints,(void *)0x0,local_34);
        anoutline->points = pFVar2;
        FVar1 = local_34[0];
        if (local_34[0] == 0) {
          pcVar3 = (char *)ft_mem_realloc(memory,1,0,(ulong)numPoints,(void *)0x0,local_34);
          anoutline->tags = pcVar3;
          FVar1 = local_34[0];
          if (local_34[0] == 0) {
            psVar4 = (short *)ft_mem_realloc(memory,2,0,(ulong)(uint)numContours,(void *)0x0,
                                             local_34);
            anoutline->contours = psVar4;
            FVar1 = local_34[0];
            if (local_34[0] == 0) {
              anoutline->n_points = (short)numPoints;
              anoutline->n_contours = (short)numContours;
              *(byte *)&anoutline->flags = (byte)anoutline->flags | 1;
              return 0;
            }
          }
        }
        *(byte *)&anoutline->flags = (byte)anoutline->flags | 1;
        FT_Outline_Done_Internal(memory,anoutline);
      }
      else {
        FVar1 = 10;
      }
    }
  }
  return FVar1;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_New_Internal( FT_Memory    memory,
                           FT_UInt      numPoints,
                           FT_Int       numContours,
                           FT_Outline  *anoutline )
  {
    FT_Error  error;


    if ( !anoutline || !memory )
      return FT_THROW( Invalid_Argument );

    *anoutline = null_outline;

    if ( numContours < 0                  ||
         (FT_UInt)numContours > numPoints )
      return FT_THROW( Invalid_Argument );

    if ( numPoints > FT_OUTLINE_POINTS_MAX )
      return FT_THROW( Array_Too_Large );

    if ( FT_NEW_ARRAY( anoutline->points,   numPoints   ) ||
         FT_NEW_ARRAY( anoutline->tags,     numPoints   ) ||
         FT_NEW_ARRAY( anoutline->contours, numContours ) )
      goto Fail;

    anoutline->n_points    = (FT_Short)numPoints;
    anoutline->n_contours  = (FT_Short)numContours;
    anoutline->flags      |= FT_OUTLINE_OWNER;

    return FT_Err_Ok;

  Fail:
    anoutline->flags |= FT_OUTLINE_OWNER;
    FT_Outline_Done_Internal( memory, anoutline );

    return error;
  }